

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# o3dgcFIFO.h
# Opt level: O3

O3DGCErrorCode __thiscall o3dgc::FIFO<long>::Allocate(FIFO<long> *this,unsigned_long size)

{
  long *plVar1;
  
  if (size != 0) {
    if (this->m_allocated < size) {
      if (this->m_buffer != (long *)0x0) {
        operator_delete__(this->m_buffer);
      }
      this->m_allocated = size;
      plVar1 = (long *)operator_new__(-(ulong)(size >> 0x3d != 0) | size << 3);
      this->m_buffer = plVar1;
    }
    this->m_size = 0;
    this->m_start = 0;
    this->m_end = 0;
    return O3DGC_OK;
  }
  __assert_fail("size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/../contrib/Open3DGC/o3dgcFIFO.h"
                ,0x34,"O3DGCErrorCode o3dgc::FIFO<long>::Allocate(unsigned long) [T = long]");
}

Assistant:

O3DGCErrorCode          Allocate(unsigned long size)
                                {
                                    assert(size > 0);
                                    if (size > m_allocated)
                                    {
                                        delete [] m_buffer;
                                        m_allocated = size;
                                        m_buffer = new T [m_allocated];
                                    }
                                    Clear();
                                    return O3DGC_OK;
                                }